

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_lu.cc
# Opt level: O2

void X509_STORE_free(X509_STORE *v)

{
  int iVar1;
  
  if (v != (X509_STORE *)0x0) {
    iVar1 = CRYPTO_refcount_dec_and_test_zero((CRYPTO_refcount_t *)&v->cert_crl);
    if (iVar1 != 0) {
      CRYPTO_MUTEX_cleanup((CRYPTO_MUTEX *)&v->objs);
      sk_X509_LOOKUP_pop_free((stack_st_X509_LOOKUP *)v->check_revocation,X509_LOOKUP_free);
      sk_X509_OBJECT_pop_free(*(stack_st_X509_OBJECT **)v,X509_OBJECT_free);
      X509_VERIFY_PARAM_free((X509_VERIFY_PARAM *)v->get_crl);
      OPENSSL_free(v);
      return;
    }
  }
  return;
}

Assistant:

void X509_STORE_free(X509_STORE *vfy) {
  if (vfy == nullptr || !CRYPTO_refcount_dec_and_test_zero(&vfy->references)) {
    return;
  }

  CRYPTO_MUTEX_cleanup(&vfy->objs_lock);
  sk_X509_LOOKUP_pop_free(vfy->get_cert_methods, X509_LOOKUP_free);
  sk_X509_OBJECT_pop_free(vfy->objs, X509_OBJECT_free);
  X509_VERIFY_PARAM_free(vfy->param);
  OPENSSL_free(vfy);
}